

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int ssl_use_certificate(CERT *cert,X509 *x)

{
  bool bVar1;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_38;
  undefined4 local_2c;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_28;
  UniquePtr<CRYPTO_BUFFER> buffer;
  X509 *x_local;
  CERT *cert_local;
  
  buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)x;
  if (x == (X509 *)0x0) {
    ERR_put_error(0x10,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x238);
    cert_local._4_4_ = 0;
  }
  else {
    bssl::x509_to_buffer((bssl *)&local_28,x);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
    if (bVar1) {
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr(&local_38,&local_28);
      bVar1 = bssl::ssl_set_cert(cert,&local_38);
      cert_local._4_4_ = (uint)bVar1;
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
    }
    else {
      cert_local._4_4_ = 0;
    }
    local_2c = 1;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  }
  return cert_local._4_4_;
}

Assistant:

static int ssl_use_certificate(CERT *cert, X509 *x) {
  if (x == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x);
  if (!buffer) {
    return 0;
  }

  return ssl_set_cert(cert, std::move(buffer));
}